

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall ctemplate::TemplateCache::DoneWithGetTemplatePtrs(TemplateCache *this)

{
  RefcountedTemplate *this_00;
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_true>
  local_28;
  _Node_iterator_base<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_true>
  local_20;
  iterator it;
  WriterMutexLock ml;
  TemplateCache *this_local;
  
  WriterMutexLock::WriterMutexLock((WriterMutexLock *)&it,this->mutex_);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
       ::begin(this->get_template_calls_);
  while( true ) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
         ::end(this->get_template_calls_);
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_false,_true>
                           *)&local_20);
    this_00 = ppVar2->first;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_false,_true>
                           *)&local_20);
    RefcountedTemplate::DecRefN(this_00,ppVar2->second);
    std::__detail::
    _Node_iterator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_false,_true>
    ::operator++((_Node_iterator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_false,_true>
                  *)&local_20);
  }
  std::
  unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
  ::clear(this->get_template_calls_);
  WriterMutexLock::~WriterMutexLock((WriterMutexLock *)&it);
  return;
}

Assistant:

void TemplateCache::DoneWithGetTemplatePtrs() {
  WriterMutexLock ml(mutex_);
  for (TemplateCallMap::iterator it = get_template_calls_->begin();
       it != get_template_calls_->end(); ++it) {
    it->first->DecRefN(it->second);  // it.second: # of times GetTpl was called
  }
  get_template_calls_->clear();
}